

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

void __thiscall
toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::cleanup
          (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *this,
          EVP_PKEY_CTX *ctx)

{
  value_t vVar1;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *this_local;
  
  vVar1 = this->type_;
  if (vVar1 == string) {
    string::~string(&(this->field_1).string_);
  }
  else if (vVar1 == array) {
    detail::
    storage<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
    ::~storage((storage<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                *)&(this->field_1).string_);
  }
  else if (vVar1 == table) {
    detail::
    storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_>
    ::~storage((storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_>
                *)&(this->field_1).string_);
  }
  return;
}

Assistant:

void cleanup() noexcept
    {
        switch(this->type_)
        {
            case value_t::string : {string_.~string();       return;}
            case value_t::array  : {array_.~array_storage(); return;}
            case value_t::table  : {table_.~table_storage(); return;}
            default              : return;
        }
    }